

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O1

int __thiscall VC1StreamReader::decodeFrame(VC1StreamReader *this,uint8_t *buff)

{
  int64_t *piVar1;
  VC1Frame *this_00;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int64_t bTiming;
  int64_t local_28;
  
  if (this->m_spsFound == 0) {
    return 1;
  }
  this_00 = &this->m_frame;
  iVar3 = VC1Frame::decode_frame_direct
                    (this_00,&this->m_sequence,buff + 1,
                     (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  if (iVar3 == 0) {
    local_28 = 0;
    iVar3 = 0;
    if ((((this->m_sequence).max_b_frames != '\0') &&
        (iVar3 = 0, (this->m_frame).pict_type < B_TYPE)) &&
       (iVar3 = getNextBFrames(this,buff,&local_28), iVar3 == -1)) {
      return -10;
    }
    this->m_lastIFrame = (this->m_frame).pict_type == I_TYPE;
    piVar2 = &(this->super_MPEGStreamReader).m_totalFrameNum;
    *piVar2 = *piVar2 + 1;
    lVar4 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    piVar1 = &(this->super_MPEGStreamReader).m_curDts;
    *piVar1 = *piVar1 + this->m_prevDtsInc;
    if ((this->m_sequence).pulldown != 0) {
      if (((this->m_sequence).interlace == true) && ((this->m_sequence).psf == 0)) {
        if ((this->m_frame).rff == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = (this->super_MPEGStreamReader).m_pcrIncPerField;
        }
        lVar4 = lVar4 + lVar5;
      }
      else {
        lVar4 = lVar4 * ((ulong)(this->m_frame).rptfrm + 1);
      }
    }
    this->m_prevDtsInc = lVar4;
    if ((this->super_MPEGStreamReader).m_removePulldown == true) {
      MPEGStreamReader::checkPulldownSync(&this->super_MPEGStreamReader);
      piVar1 = &(this->super_MPEGStreamReader).m_testPulldownDts;
      *piVar1 = *piVar1 + this->m_prevDtsInc;
      this->m_prevDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
      if ((this->m_sequence).pulldown != 0) {
        if (((this->m_sequence).interlace == true) && ((this->m_sequence).psf == 0)) {
          if (0 < (this->m_frame).rff) {
            updateBits((BitStreamReader *)this_00,(this->m_frame).rptfrmBitPos + 1,1,0);
          }
          (this->m_frame).rff = 0;
        }
        else {
          if ((this->m_frame).rptfrm != '\0') {
            updateBits((BitStreamReader *)this_00,(this->m_frame).rptfrmBitPos,2,0);
          }
          (this->m_frame).rptfrm = '\0';
        }
      }
    }
    if ((this->m_frame).pict_type < B_TYPE) {
      lVar4 = (this->super_MPEGStreamReader).m_curDts;
      if ((this->super_MPEGStreamReader).m_removePulldown == true) {
        lVar4 = (long)iVar3 * (this->super_MPEGStreamReader).m_pcrIncPerFrame + lVar4;
      }
      else {
        lVar4 = lVar4 + local_28;
      }
    }
    else {
      lVar4 = (this->super_MPEGStreamReader).m_curDts -
              (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    }
    (this->super_MPEGStreamReader).m_curPts = lVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int VC1StreamReader::decodeFrame(uint8_t* buff)
{
    if (!m_spsFound)
        return NALUnit::SPS_OR_PPS_NOT_READY;
    const int rez = m_frame.decode_frame_direct(m_sequence, buff + 1, m_bufEnd);
    if (rez != 0)
        return rez;

    int nextBFrameCnt = 0;
    int64_t bTiming = 0;
    if (m_sequence.max_b_frames > 0 &&
        (m_frame.pict_type == VC1PictType::I_TYPE || m_frame.pict_type == VC1PictType::P_TYPE))
    {
        nextBFrameCnt = getNextBFrames(buff, bTiming);
        if (nextBFrameCnt == -1)
            return NOT_ENOUGH_BUFFER;
    }

    m_lastIFrame = m_frame.pict_type == VC1PictType::I_TYPE;
    m_totalFrameNum++;

    m_curDts += m_prevDtsInc;

    const int64_t pcrIncVal = m_pcrIncPerFrame;
    // if (m_frame.fcm == 2) // coded field
    //	pcrIncVal = m_pcrIncPerField;

    if (m_sequence.pulldown)
    {
        if (!m_sequence.interlace || m_sequence.psf)
        {
            m_prevDtsInc = pcrIncVal * (static_cast<int64_t>(m_frame.rptfrm) + 1);
        }
        else
        {
            m_prevDtsInc = pcrIncVal + (m_frame.rff ? m_pcrIncPerField : 0);
        }
    }
    else
        m_prevDtsInc = pcrIncVal;

    if (m_removePulldown)
    {
        checkPulldownSync();
        m_testPulldownDts += m_prevDtsInc;

        m_prevDtsInc = m_pcrIncPerFrame;
        if (m_sequence.pulldown)
        {
            if (!m_sequence.interlace || m_sequence.psf)
            {
                if (m_frame.rptfrm > 0)
                    updateBits(m_frame.getBitReader(), m_frame.rptfrmBitPos, 2, 0);
                m_frame.rptfrm = 0;
            }
            else
            {
                if (m_frame.rff > 0)
                    updateBits(m_frame.getBitReader(), m_frame.rptfrmBitPos + 1, 1, 0);
                m_frame.rff = 0;
            }
        }
        /*
        if (m_frame.fcm == 2) {
                m_frame.fcm = 1;
                buff[1] &= 0xbf; // 1011 1111 set fcm to 1
        }
        */
    }

    if (m_frame.pict_type == VC1PictType::I_TYPE || m_frame.pict_type == VC1PictType::P_TYPE)
    {
        if (m_removePulldown)
            m_curPts = m_curDts + (nextBFrameCnt)*m_pcrIncPerFrame;
        else
            m_curPts = m_curDts + bTiming;
    }
    else
        m_curPts = m_curDts - m_pcrIncPerFrame;  // pcrInc;
    return 0;
}